

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

bool draco::parser::ParseFloat(DecoderBuffer *buffer,float *value)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  int32_t exponent;
  string local_40;
  
  lVar2 = buffer->data_size_;
  lVar1 = buffer->pos_ + 1;
  if (lVar2 < lVar1) {
LAB_0011984f:
    bVar3 = false;
  }
  else {
    bVar4 = buffer->data_[buffer->pos_];
    bVar8 = bVar4 == 0x2d;
    bVar3 = (bVar4 != 0x2b) == bVar8;
    if (bVar3) {
      buffer->pos_ = lVar1;
    }
    dVar11 = 0.0;
    bVar5 = false;
    lVar1 = buffer->pos_;
    while ((lVar7 = lVar1 + 1, lVar7 <= lVar2 &&
           (bVar4 = buffer->data_[lVar1], (byte)(bVar4 - 0x30) < 10))) {
      dVar11 = dVar11 * 10.0 + (double)(int)(bVar4 - 0x30);
      buffer->pos_ = lVar7;
      bVar5 = true;
      lVar1 = lVar7;
    }
    if (bVar4 == 0x2e) {
      dVar10 = 1.0;
      while( true ) {
        buffer->pos_ = lVar7;
        if ((lVar2 < lVar7 + 1) || (bVar4 = buffer->data_[lVar7], 9 < (byte)(bVar4 - 0x30))) break;
        dVar10 = dVar10 * 0.1;
        dVar11 = dVar11 + (double)(int)(bVar4 - 0x30) * dVar10;
        bVar5 = true;
        lVar7 = lVar7 + 1;
      }
    }
    if (bVar5) {
      dVar10 = dVar11;
      if ((bVar4 & 0xdf) == 0x45) {
        buffer->pos_ = buffer->pos_ + 1;
        local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffff00000000;
        bVar5 = ParseSignedInt(buffer,(int32_t *)&local_40);
        if (!bVar5) goto LAB_0011984f;
        dVar10 = pow(10.0,(double)(int)local_40._M_dataplus._M_p);
        dVar10 = dVar11 * dVar10;
      }
    }
    else {
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      bVar5 = ParseString(buffer,&local_40);
      if (bVar5) {
        iVar6 = std::__cxx11::string::compare((char *)&local_40);
        bVar5 = true;
        dVar10 = INFINITY;
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)&local_40);
          if (iVar6 == 0) {
            dVar10 = INFINITY;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_40);
            if ((iVar6 != 0) &&
               (iVar6 = std::__cxx11::string::compare((char *)&local_40), iVar6 != 0))
            goto LAB_001199f6;
            dVar10 = nan("");
          }
        }
      }
      else {
LAB_001199f6:
        bVar5 = false;
        dVar10 = dVar11;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,
                        CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                                 local_40.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar5) goto LAB_0011984f;
    }
    fVar9 = (float)dVar10;
    if (bVar3 && bVar8) {
      fVar9 = -fVar9;
    }
    *value = fVar9;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ParseFloat(DecoderBuffer *buffer, float *value) {
  // Read optional sign.
  char ch;
  if (!buffer->Peek(&ch)) {
    return false;
  }
  int sign = GetSignValue(ch);
  if (sign != 0) {
    buffer->Advance(1);
  } else {
    sign = 1;
  }

  // Parse integer component.
  bool have_digits = false;
  double v = 0.0;
  while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
    v *= 10.0;
    v += (ch - '0');
    buffer->Advance(1);
    have_digits = true;
  }
  if (ch == '.') {
    // Parse fractional component.
    buffer->Advance(1);
    double fraction = 1.0;
    while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
      fraction *= 0.1;
      v += (ch - '0') * fraction;
      buffer->Advance(1);
      have_digits = true;
    }
  }

  if (!have_digits) {
    // Check for special constants (inf, nan, ...).
    std::string text;
    if (!ParseString(buffer, &text)) {
      return false;
    }
    if (text == "inf" || text == "Inf") {
      v = std::numeric_limits<double>::infinity();
    } else if (text == "nan" || text == "NaN") {
      v = nan("");
    } else {
      // Invalid string.
      return false;
    }
  } else {
    // Handle exponent if present.
    if (ch == 'e' || ch == 'E') {
      buffer->Advance(1);  // Skip 'e' marker.

      // Parse integer exponent.
      int32_t exponent = 0;
      if (!ParseSignedInt(buffer, &exponent)) {
        return false;
      }

      // Apply exponent scaling to value.
      v *= pow(static_cast<double>(10.0), exponent);
    }
  }

  *value = (sign < 0) ? static_cast<float>(-v) : static_cast<float>(v);
  return true;
}